

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::DisposeIntersectNodes(Clipper *this)

{
  IntersectNode *pIVar1;
  IntersectNode *pIVar2;
  
  pIVar2 = this->m_IntersectNodes;
  while (pIVar2 != (IntersectNode *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete(pIVar2);
    this->m_IntersectNodes = pIVar1;
    pIVar2 = pIVar1;
  }
  return;
}

Assistant:

void Clipper::DisposeIntersectNodes()
{
  while ( m_IntersectNodes )
  {
    IntersectNode* iNode = m_IntersectNodes->next;
    delete m_IntersectNodes;
    m_IntersectNodes = iNode;
  }
}